

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void AddClass(TidyDocImpl *doc,Node *node,ctmbstr classname)

{
  AttVal *classattr_00;
  AttVal *classattr;
  ctmbstr classname_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  classattr_00 = prvTidyAttrGetById(node,TidyAttr_CLASS);
  if (classattr_00 == (AttVal *)0x0) {
    prvTidyAddAttribute(doc,node,"class",classname);
  }
  else {
    prvTidyAppendToClassAttr(doc,classattr_00,classname);
  }
  return;
}

Assistant:

static void AddClass( TidyDocImpl* doc, Node* node, ctmbstr classname )
{
    AttVal *classattr = TY_(AttrGetById)(node, TidyAttr_CLASS);;

    /*
     if there already is a class attribute
     then append class name after a space.
    */
    if (classattr)
        TY_(AppendToClassAttr)( doc, classattr, classname );
    else /* create new class attribute */
        TY_(AddAttribute)( doc, node, "class", classname );
}